

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O0

void __thiscall
TPZAdmChunkVector<TPZGraphNode,_10>::Write
          (TPZAdmChunkVector<TPZGraphNode,_10> *this,TPZStream *buf,int withclassid)

{
  TPZVec<int> *vec;
  undefined4 in_EDX;
  TPZChunkVector<TPZGraphNode,_10> *in_RSI;
  TPZChunkVector<TPZGraphNode,_10> *in_RDI;
  int val;
  uint64_t nc;
  uint64_t c;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  TPZVec<int> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  vec = (TPZVec<int> *)TPZChunkVector<TPZGraphNode,_10>::NElements(in_RDI);
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[6])(in_RSI,&stack0xffffffffffffffd8,1);
  for (this_00 = (TPZVec<int> *)0x0; this_00 < vec;
      this_00 = (TPZVec<int> *)((long)&this_00->_vptr_TPZVec + 1)) {
    TPZChunkVector<TPZGraphNode,_10>::operator[](in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    WriteInternal<TPZGraphNode,_nullptr>
              ((TPZGraphNode *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (TPZStream *)in_RDI,0);
  }
  as_integer<TPZAdmChunkVector<TPZGraphNode,10>::CompactScheme>
            (*(CompactScheme *)&in_RDI[1].super_TPZSavable._vptr_TPZSavable);
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[3])(in_RSI,&stack0xffffffffffffffd4,1);
  TPZStream::Write<int>((TPZStream *)this_00,vec);
  TPZStream::Write<int>((TPZStream *)this_00,vec);
  return;
}

Assistant:

void Write(TPZStream& buf, int withclassid) const override{
        uint64_t c, nc = this->NElements();
        buf.Write(&nc);
        for (c = 0; c < nc; c++){
            WriteInternal(this->operator [](c), buf, withclassid);
        }
        int val = as_integer( this->fCompactScheme );
        buf.Write(&val);
        buf.Write(this->fFree);
        buf.Write(this->fNFree);
    }